

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void linearize_function(LinearizerState *linearizer)

{
  uint uVar1;
  Proc *proc;
  AstNode *pAVar2;
  Proc *proc_00;
  AstNode *pAVar3;
  C_MemoryAllocator *pCVar4;
  _Bool _Var5;
  BasicBlock *pBVar6;
  BasicBlock *pBVar7;
  void *pvVar8;
  undefined1 *ptr;
  uint *ptr_00;
  uint line_number;
  Scope *scope;
  PtrListIterator PStack_48;
  
  proc = linearizer->current_proc;
  if (proc == (Proc *)0x0) {
    __assert_fail("proc != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe4,"void linearize_function(LinearizerState *)");
  }
  pAVar2 = proc->function_expr;
  if (pAVar2->type != EXPR_FUNCTION) {
    __assert_fail("func_expr->type == EXPR_FUNCTION",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe6,"void linearize_function(LinearizerState *)");
  }
  pBVar6 = create_block(proc);
  if (pBVar6->index != 0) {
    __assert_fail("entry->index == ENTRY_BLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xb9b,"void initialize_graph(Proc *)");
  }
  pBVar7 = create_block(proc);
  if (pBVar7->index == 1) {
    start_block(proc,pBVar6,proc->function_expr->line_number);
    if (proc->node_count < 2) {
      __assert_fail("proc->node_count >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0xbe8,"void linearize_function(LinearizerState *)");
    }
    if (*proc->nodes != (BasicBlock *)0x0) {
      if (proc->nodes[1] == (BasicBlock *)0x0) {
        __assert_fail("proc->nodes[EXIT_BLOCK] != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                      ,0xbea,"void linearize_function(LinearizerState *)");
      }
      start_scope((LinearizerState *)proc,(Proc *)(pAVar2->field_2).for_stmt.for_statement_list,
                  scope);
      proc_00 = linearizer->current_proc;
      pAVar3 = proc_00->function_expr;
      raviX_ptrlist_forward_iterator(&PStack_48,(PtrList *)(pAVar3->field_2).function_expr.args);
      pvVar8 = raviX_ptrlist_iter_next(&PStack_48);
      while (pvVar8 != (void *)0x0) {
        if (*(Pseudo **)((long)pvVar8 + 0x38) == (Pseudo *)0x0) {
          __assert_fail("sym->variable.pseudo",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                        ,0x2da,"void linearize_function_args(LinearizerState *)");
        }
        instruct_totype(proc_00,*(Pseudo **)((long)pvVar8 + 0x38),(VariableType *)((long)pvVar8 + 8)
                        ,pAVar3->line_number);
        pvVar8 = raviX_ptrlist_iter_next(&PStack_48);
      }
      linearize_statement_list(proc,(pAVar2->field_2).function_expr.function_statement_list);
      end_scope((LinearizerState *)proc,(Proc *)(ulong)pAVar2->line_number,line_number);
      _Var5 = is_block_terminated(proc->current_bb);
      if (!_Var5) {
        uVar1 = pAVar2->line_number;
        pCVar4 = proc->linearizer->compiler_state->allocator;
        ptr = (undefined1 *)(*pCVar4->calloc)(pCVar4->arena,1,0x28);
        *ptr = 1;
        *(uint *)(ptr + 0x20) = uVar1;
        pBVar6 = proc->nodes[1];
        pCVar4 = proc->linearizer->compiler_state->allocator;
        ptr_00 = (uint *)(*pCVar4->calloc)(pCVar4->arena,1,0x30);
        *ptr_00 = *ptr_00 & 0xfffffff0 | 10;
        *(BasicBlock **)(ptr_00 + 2) = pBVar6;
        raviX_ptrlist_add((PtrList **)(ptr + 0x10),ptr_00,
                          proc->linearizer->compiler_state->allocator);
        if (*(BasicBlock **)(ptr + 0x18) != proc->current_bb &&
            *(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) {
          __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                        ,0x1b1,"void add_instruction(Proc *, Instruction *)");
        }
        raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                          proc->linearizer->compiler_state->allocator);
        *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
      }
      return;
    }
    __assert_fail("proc->nodes[ENTRY_BLOCK] != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe9,"void linearize_function(LinearizerState *)");
  }
  __assert_fail("exit->index == EXIT_BLOCK",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                ,0xb9d,"void initialize_graph(Proc *)");
}

Assistant:

static void linearize_function(LinearizerState *linearizer)
{
	Proc *proc = linearizer->current_proc;
	assert(proc != NULL);
	AstNode *func_expr = proc->function_expr;
	assert(func_expr->type == EXPR_FUNCTION);
	initialize_graph(proc);
	assert(proc->node_count >= 2);
	assert(proc->nodes[ENTRY_BLOCK] != NULL);
	assert(proc->nodes[EXIT_BLOCK] != NULL);
	start_scope(linearizer, proc, func_expr->function_expr.main_block);
	linearize_function_args(linearizer);
	linearize_statement_list(proc, func_expr->function_expr.function_statement_list);
	end_scope(linearizer, proc, func_expr->line_number);
	if (!is_block_terminated(proc->current_bb)) {
		Instruction *insn = allocate_instruction(proc, op_ret, func_expr->line_number);
		add_instruction_target(proc, insn, allocate_block_pseudo(proc, proc->nodes[EXIT_BLOCK]));
		add_instruction(proc, insn);
	}
}